

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws_dll2.c
# Opt level: O0

void lws_dll2_describe(lws_dll2_owner_t *owner,char *desc)

{
  lws_dll2 *plVar1;
  ulong uVar2;
  lws_dll2 *tp;
  lws_dll2 *p;
  int n;
  char *desc_local;
  lws_dll2_owner_t *owner_local;
  
  p._4_4_ = 1;
  _lws_log(8,"%s: %s: owner %p: count %d, head %p, tail %p\n","lws_dll2_describe",desc,owner,
           (ulong)owner->count,owner->head,owner->tail);
  tp = lws_dll2_get_head(owner);
  while (tp != (lws_dll2 *)0x0) {
    plVar1 = tp->next;
    uVar2 = (ulong)p._4_4_;
    p._4_4_ = p._4_4_ + 1;
    _lws_log(8,"%s:    %d: %p: owner %p, prev %p, next %p\n","lws_dll2_describe",uVar2,tp,tp->owner,
             tp->prev,tp->next);
    tp = plVar1;
  }
  return;
}

Assistant:

void
lws_dll2_describe(lws_dll2_owner_t *owner, const char *desc)
{
	int n = 1;

	lwsl_info("%s: %s: owner %p: count %d, head %p, tail %p\n",
		    __func__, desc, owner, (int)owner->count, owner->head, owner->tail);

	lws_start_foreach_dll_safe(struct lws_dll2 *, p, tp,
				   lws_dll2_get_head(owner)) {
		lwsl_info("%s:    %d: %p: owner %p, prev %p, next %p\n",
			    __func__, n++, p, p->owner, p->prev, p->next);
	} lws_end_foreach_dll_safe(p, tp);
}